

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O2

Value * __thiscall camp::TagHolder::tagId(TagHolder *this,size_t index)

{
  OutOfRange *__return_storage_ptr__;
  difference_type __d;
  allocator local_aa;
  allocator local_a9;
  const_iterator it;
  string local_88;
  OutOfRange local_68;
  
  if (index < (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    it._M_node = (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    __advance<std::_Rb_tree_const_iterator<std::pair<camp::Value_const,camp::detail::Getter<camp::Value>>>,long>
              (&it,index);
    return (Value *)(it._M_node + 1);
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange
            (&local_68,index,(this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string
            ((string *)&it,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/tagholder.cpp"
             ,&local_a9);
  std::__cxx11::string::string
            ((string *)&local_88,"const Value &camp::TagHolder::tagId(std::size_t) const",&local_aa)
  ;
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_68,(string *)&it,0x37,&local_88);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Value& TagHolder::tagId(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_tags.size())
        CAMP_ERROR(OutOfRange(index, m_tags.size()));

    TagsTable::const_iterator it = m_tags.begin();
    std::advance(it, index);

    return it->first;
}